

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int iVar8;
  GetterYs<float> *pGVar9;
  TransformerLogLin *pTVar10;
  ImPlotPlot *pIVar11;
  GetterYRef *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  double dVar15;
  ImVec2 IVar16;
  ushort uVar17;
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  bool bVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  ImVec2 IVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  pIVar18 = GImPlot;
  pGVar9 = this->Getter1;
  dVar25 = (double)(prim + 1);
  pTVar10 = this->Transformer;
  iVar8 = pGVar9->Count;
  fVar2 = *(float *)((long)pGVar9->Ys +
                    (long)(((prim + 1 + pGVar9->Offset) % iVar8 + iVar8) % iVar8) *
                    (long)pGVar9->Stride);
  dVar15 = log10((pGVar9->XScale * dVar25 + pGVar9->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar19 = GImPlot;
  pIVar11 = pIVar18->CurrentPlot;
  dVar7 = (pIVar11->XAxis).Range.Min;
  iVar8 = pTVar10->YAxis;
  fVar23 = (float)((((double)(float)(dVar15 / pIVar18->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar8].Min.x);
  fVar24 = (float)(((double)fVar2 - pIVar11->YAxis[iVar8].Range.Min) * pIVar18->My[iVar8] +
                  (double)pIVar18->PixelRange[iVar8].Min.y);
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  dVar7 = pGVar12->YRef;
  dVar25 = log10((dVar25 * pGVar12->XScale + pGVar12->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar11 = pIVar19->CurrentPlot;
  dVar15 = (pIVar11->XAxis).Range.Min;
  iVar8 = pTVar10->YAxis;
  fVar29 = (float)((((double)(float)(dVar25 / pIVar19->LogDenX) *
                     ((pIVar11->XAxis).Range.Max - dVar15) + dVar15) - dVar15) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar8].Min.x);
  fVar31 = (float)((dVar7 - pIVar11->YAxis[iVar8].Range.Min) * pIVar19->My[iVar8] +
                  (double)pIVar19->PixelRange[iVar8].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar27 = fVar3;
  if (fVar5 <= fVar3) {
    fVar27 = fVar5;
  }
  if (fVar24 <= fVar27) {
    fVar27 = fVar24;
  }
  if (fVar31 <= fVar27) {
    fVar27 = fVar31;
  }
  bVar20 = false;
  if ((fVar27 < (cull_rect->Max).y) &&
     (fVar27 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar22 = -(uint)(fVar24 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar24 | uVar22 & (uint)fVar27),
     uVar22 = -(uint)(fVar31 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar31 | uVar22 & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
    fVar27 = fVar2;
    if (fVar4 <= fVar2) {
      fVar27 = fVar4;
    }
    if (fVar23 <= fVar27) {
      fVar27 = fVar23;
    }
    if (fVar29 <= fVar27) {
      fVar27 = fVar29;
    }
    bVar20 = false;
    if (fVar27 < (cull_rect->Max).x) {
      fVar27 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar22 = -(uint)(fVar23 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar27);
      uVar22 = -(uint)(fVar29 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar29 | uVar22 & (uint)fVar27);
      bVar20 = (cull_rect->Min).x <= fVar27 && fVar27 != (cull_rect->Min).x;
    }
  }
  IVar26.y = fVar24;
  IVar26.x = fVar23;
  IVar28.y = fVar31;
  IVar28.x = fVar29;
  if (bVar20 != false) {
    fVar27 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar33 = fVar2 * fVar24 - fVar23 * fVar3;
    fVar32 = fVar4 * fVar31 - fVar29 * fVar5;
    fVar30 = (fVar2 - fVar23) * (fVar5 - fVar31) - (fVar4 - fVar29) * (fVar3 - fVar24);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = this->Col;
    pIVar13[1].pos = IVar26;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = this->Col;
    IVar16.y = ((fVar5 - fVar31) * fVar33 - (fVar3 - fVar24) * fVar32) / fVar30;
    IVar16.x = (fVar33 * (fVar4 - fVar29) - (fVar2 - fVar23) * fVar32) / fVar30;
    pIVar13[2].pos = IVar16;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = this->Col;
    pIVar13[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = this->Col;
    pIVar13[4].pos = IVar28;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar13 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar14 = IVar21;
    uVar17 = -(ushort)(fVar6 < fVar27 && fVar24 < fVar31 || fVar27 < fVar6 && fVar31 < fVar24) & 1;
    pIVar14[1] = IVar21 + uVar17 + 1;
    pIVar14[2] = IVar21 + 3;
    pIVar14[3] = IVar21 + 1;
    pIVar14[4] = (uVar17 ^ 3) + IVar21;
    pIVar14[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  this->P11 = IVar26;
  this->P12 = IVar28;
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }